

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua-socket.c
# Opt level: O0

int lreadline(lua_State *L)

{
  _Bool _Var1;
  int iVar2;
  char *sep_00;
  int local_50;
  int local_4c;
  int bytes;
  int from;
  buffer_node *current;
  int i;
  char *sep;
  size_t seplen;
  socket_buffer *psStack_20;
  _Bool check;
  socket_buffer *sb;
  lua_State *L_local;
  
  sb = (socket_buffer *)L;
  psStack_20 = (socket_buffer *)lua_touserdata(L,1);
  if (psStack_20 == (socket_buffer *)0x0) {
    L_local._4_4_ = luaL_error((lua_State *)sb,"Need buffer object at param 1");
  }
  else {
    iVar2 = lua_type((lua_State *)sb,2);
    seplen._7_1_ = (iVar2 == 5 ^ 0xffU) & 1;
    sep = (char *)0x0;
    sep_00 = luaL_checklstring((lua_State *)sb,3,(size_t *)&sep);
    _bytes = psStack_20->head;
    if (_bytes == (buffer_node *)0x0) {
      L_local._4_4_ = 0;
    }
    else {
      local_4c = psStack_20->offset;
      local_50 = _bytes->sz - local_4c;
      for (current._4_4_ = 0; current._4_4_ <= psStack_20->size - (int)sep;
          current._4_4_ = current._4_4_ + 1) {
        _Var1 = check_sep(_bytes,local_4c,sep_00,(int)sep);
        if (_Var1) {
          if ((seplen._7_1_ & 1) == 0) {
            pop_lstring((lua_State *)sb,psStack_20,current._4_4_ + (int)sep,(int)sep);
            psStack_20->size = psStack_20->size - (current._4_4_ + (int)sep);
          }
          else {
            lua_pushboolean((lua_State *)sb,1);
          }
          return 1;
        }
        local_4c = local_4c + 1;
        local_50 = local_50 + -1;
        if (local_50 == 0) {
          _bytes = _bytes->next;
          local_4c = 0;
          if (_bytes == (buffer_node *)0x0) break;
          local_50 = _bytes->sz;
        }
      }
      L_local._4_4_ = 0;
    }
  }
  return L_local._4_4_;
}

Assistant:

static int
lreadline(lua_State *L) {
	struct socket_buffer * sb = lua_touserdata(L, 1);
	if (sb == NULL) {
		return luaL_error(L, "Need buffer object at param 1");
	}
	// only check
	bool check = !lua_istable(L, 2);
	size_t seplen = 0;
	const char *sep = luaL_checklstring(L,3,&seplen);
	int i;
	struct buffer_node *current = sb->head;
	if (current == NULL)
		return 0;
	int from = sb->offset;
	int bytes = current->sz - from;
	for (i=0;i<=sb->size - (int)seplen;i++) {
		if (check_sep(current, from, sep, seplen)) {
			if (check) {
				lua_pushboolean(L,true);
			} else {
				pop_lstring(L, sb, i+seplen, seplen);
				sb->size -= i+seplen;
			}
			return 1;
		}
		++from;
		--bytes;
		if (bytes == 0) {
			current = current->next;
			from = 0;
			if (current == NULL)
				break;
			bytes = current->sz;
		}
	}
	return 0;
}